

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::parseMuxOpt(TSMuxer *this,string *opts)

{
  bool bVar1;
  int32_t value;
  char *pcVar2;
  reference pvVar3;
  size_type sVar4;
  int64_t iVar5;
  reference pcVar6;
  double dVar7;
  string local_120 [8];
  string prefix;
  char *j;
  iterator __end11;
  iterator __begin11;
  value_type *__range11;
  string postfix;
  int64_t coeff;
  string local_88;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramPair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  string *opts_local;
  TSMuxer *this_local;
  
  params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = opts;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1,pcVar2,' ');
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  i = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&i);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      return;
    }
    paramPair.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    trimStr(&local_88,
            paramPair.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68,pcVar2,'=');
    std::__cxx11::string::~string((string *)&local_88);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    if (!bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,0);
      bVar1 = std::operator==(pvVar3,"--no-pcr-on-video-pid");
      if (bVar1) {
        setPCROnVideoPID(this,false);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,0);
        bVar1 = std::operator==(pvVar3,"--new-audio-pes");
        if (bVar1) {
          setNewStyleAudioPES(this,true);
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,0);
          bVar1 = std::operator==(pvVar3,"--no-hdmv-descriptors");
          if (bVar1) {
            this->m_hdmvDescriptors = false;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,0);
            bVar1 = std::operator==(pvVar3,"--bitrate");
            if ((bVar1) &&
               (sVar4 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_68), 1 < sVar4)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68,1);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              dVar7 = strToDouble(pcVar2);
              setMaxBitrate(this,(int)(dVar7 * 1000.0));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68,1);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              dVar7 = strToDouble(pcVar2);
              setMinBitrate(this,(int)(dVar7 * 1000.0));
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_68,0);
              bVar1 = std::operator==(pvVar3,"--maxbitrate");
              if ((bVar1) &&
                 (sVar4 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_68), 1 < sVar4)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_68,1);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                dVar7 = strToDouble(pcVar2);
                setMaxBitrate(this,(int)(dVar7 * 1000.0));
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_68,0);
                bVar1 = std::operator==(pvVar3,"--minbitrate");
                if ((bVar1) &&
                   (sVar4 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_68), 1 < sVar4)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_68,1);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  dVar7 = strToDouble(pcVar2);
                  setMinBitrate(this,(int)(dVar7 * 1000.0));
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)local_68,0);
                  bVar1 = std::operator==(pvVar3,"--vbv-len");
                  if ((bVar1) &&
                     (sVar4 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_68), 1 < sVar4)) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_68,1);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    value = strToInt32(pcVar2);
                    setVBVBufferLen(this,value);
                  }
                  else {
                    pvVar3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)local_68,0);
                    bVar1 = std::operator==(pvVar3,"--split-duration");
                    if (bVar1) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_68,1);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      iVar5 = strToInt64(pcVar2);
                      setSplitDuration(this,iVar5 * 0x13b6d8300);
                      this->m_computeMuxStats = true;
                    }
                    else {
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_68,0);
                      bVar1 = std::operator==(pvVar3,"--split-size");
                      if (bVar1) {
                        postfix.field_2._8_8_ = 1;
                        std::__cxx11::string::string((string *)&__range11);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_68,1);
                        __end11._M_current = (char *)std::__cxx11::string::begin();
                        j = (char *)std::__cxx11::string::end();
                        while (bVar1 = __gnu_cxx::operator!=
                                                 (&__end11,(
                                                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&j), bVar1) {
                          pcVar6 = __gnu_cxx::
                                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::operator*(&__end11);
                          if (((*pcVar6 < '0') || ('9' < *pcVar6)) && (*pcVar6 != '.')) {
                            std::__cxx11::string::operator+=((string *)&__range11,*pcVar6);
                          }
                          __gnu_cxx::
                          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator++(&__end11);
                        }
                        strToUpperCase((string *)((long)&prefix.field_2 + 8),(string *)&__range11);
                        std::__cxx11::string::operator=
                                  ((string *)&__range11,(string *)(prefix.field_2._M_local_buf + 8))
                        ;
                        std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&__range11,"GB");
                        if (bVar1) {
                          postfix.field_2._8_8_ = 1000000000;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range11,"GIB");
                          if (bVar1) {
                            postfix.field_2._8_8_ = 0x40000000;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range11,"MB");
                            if (bVar1) {
                              postfix.field_2._8_8_ = 1000000;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range11,"MIB");
                              if (bVar1) {
                                postfix.field_2._8_8_ = 0x100000;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range11,"KB");
                                if (bVar1) {
                                  postfix.field_2._8_8_ = 1000;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range11,"KIB");
                                  if (bVar1) {
                                    postfix.field_2._8_8_ = 0x400;
                                  }
                                }
                              }
                            }
                          }
                        }
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_68,1);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_68,1);
                        std::__cxx11::string::size();
                        std::__cxx11::string::size();
                        std::__cxx11::string::substr((ulong)local_120,(ulong)pvVar3);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        dVar7 = strToDouble(pcVar2);
                        setSplitSize(this,(uint32_t)
                                          (long)(dVar7 * (double)(long)postfix.field_2._8_8_));
                        this->m_computeMuxStats = true;
                        std::__cxx11::string::~string(local_120);
                        std::__cxx11::string::~string((string *)&__range11);
                      }
                      else {
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)local_68,0);
                        bVar1 = std::operator==(pvVar3,"--blu-ray");
                        if (!bVar1) {
                          pvVar3 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_68,0);
                          bVar1 = std::operator==(pvVar3,"--blu-ray-v3");
                          if (!bVar1) {
                            pvVar3 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_68,0);
                            bVar1 = std::operator==(pvVar3,"--avchd");
                            if (!bVar1) {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_68,0);
                              bVar1 = std::operator==(pvVar3,"--cut-start");
                              if (!bVar1) {
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_68,0);
                                bVar1 = std::operator==(pvVar3,"--cut-end");
                                if (!bVar1) goto LAB_00352ec4;
                              }
                              this->m_computeMuxStats = true;
                              goto LAB_00352ec4;
                            }
                          }
                        }
                        this->m_bluRayMode = true;
                        this->m_computeMuxStats = true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00352ec4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void TSMuxer::parseMuxOpt(const std::string& opts)
{
    const vector<string> params = splitStr(opts.c_str(), ' ');
    for (auto& i : params)
    {
        vector<string> paramPair = splitStr(trimStr(i).c_str(), '=');
        if (paramPair.empty())
            continue;
        if (paramPair[0] == "--no-pcr-on-video-pid")
            setPCROnVideoPID(false);
        else if (paramPair[0] == "--new-audio-pes")
            setNewStyleAudioPES(true);
        else if (paramPair[0] == "--no-hdmv-descriptors")
            m_hdmvDescriptors = false;
        else if (paramPair[0] == "--bitrate" && paramPair.size() > 1)
        {
            setMaxBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
            setMinBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        }
        else if (paramPair[0] == "--maxbitrate" && paramPair.size() > 1)
            setMaxBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        else if (paramPair[0] == "--minbitrate" && paramPair.size() > 1)
            setMinBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        else if (paramPair[0] == "--vbv-len" && paramPair.size() > 1)
            setVBVBufferLen(strToInt32(paramPair[1].c_str()));
        else if (paramPair[0] == "--split-duration")
        {
            setSplitDuration(strToInt64(paramPair[1].c_str()) * INTERNAL_PTS_FREQ);
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--split-size")
        {
            int64_t coeff = 1;
            string postfix;
            for (const auto& j : paramPair[1])
                if (!((j >= '0' && j <= '9') || j == '.'))
                    postfix += j;
            postfix = strToUpperCase(postfix);
            if (postfix == "GB")
                coeff = 1000LL * 1000 * 1000;
            else if (postfix == "GIB")
                coeff = 1024LL * 1024 * 1024;
            else if (postfix == "MB")
                coeff = 1000LL * 1000;
            else if (postfix == "MIB")
                coeff = 1024LL * 1024;
            else if (postfix == "KB")
                coeff = 1000;
            else if (postfix == "KIB")
                coeff = 1024;
            string prefix = paramPair[1].substr(0, paramPair[1].size() - postfix.size());
            setSplitSize(static_cast<uint32_t>(strToDouble(prefix.c_str()) * static_cast<double>(coeff)));
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--blu-ray" || paramPair[0] == "--blu-ray-v3" || paramPair[0] == "--avchd")
        {
            m_bluRayMode = true;
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--cut-start" || paramPair[0] == "--cut-end")
        {
            m_computeMuxStats = true;
        }
    }
}